

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::run<lest::test[5]>(test (*specification) [5],texts *args,ostream *os)

{
  int iVar1;
  tests local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  tests local_38;
  
  make_tests<lest::test[5]>(&local_38,specification);
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,args);
  iVar1 = run(&local_68,&local_50,os);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_68);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  return iVar1;
}

Assistant:

int run(  C const & specification, texts args, std::ostream & os = std::cout )
{
    return run( make_tests( specification ), args, os  );
}